

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# desc_sroa.cpp
# Opt level: O2

void __thiscall
spvtools::opt::DescriptorScalarReplacement::CreateNewDecorationForNewVariable
          (DescriptorScalarReplacement *this,Instruction *old_decoration,uint32_t new_var_id,
          uint32_t new_binding)

{
  bool bVar1;
  Instruction *this_00;
  initializer_list<unsigned_int> init_list;
  initializer_list<unsigned_int> init_list_00;
  uint32_t local_54;
  _Head_base<0UL,_spvtools::opt::Instruction_*,_false> local_50;
  SmallVector<unsigned_int,_2UL> local_48;
  
  if ((old_decoration->opcode_ != OpDecorate) && (old_decoration->opcode_ != OpDecorateString)) {
    __assert_fail("old_decoration->opcode() == spv::Op::OpDecorate || old_decoration->opcode() == spv::Op::OpDecorateString"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/desc_sroa.cpp"
                  ,0x109,
                  "void spvtools::opt::DescriptorScalarReplacement::CreateNewDecorationForNewVariable(Instruction *, uint32_t, uint32_t)"
                 );
  }
  this_00 = Instruction::Clone(old_decoration,(this->super_Pass).context_);
  init_list._M_len = 1;
  init_list._M_array = &local_54;
  local_54 = new_var_id;
  local_50._M_head_impl = this_00;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_48,init_list);
  Instruction::SetInOperand(this_00,0,&local_48);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_48);
  bVar1 = anon_unknown_17::IsDecorationBinding(this_00);
  if (bVar1) {
    init_list_00._M_len = 1;
    init_list_00._M_array = &local_54;
    local_54 = new_binding;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_48,init_list_00);
    Instruction::SetInOperand(this_00,2,&local_48);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_48);
  }
  IRContext::AddAnnotationInst
            ((this->super_Pass).context_,
             (unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
              *)&local_50);
  if (local_50._M_head_impl != (Instruction *)0x0) {
    (*((local_50._M_head_impl)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
      _vptr_IntrusiveNodeBase[1])();
  }
  return;
}

Assistant:

void DescriptorScalarReplacement::CreateNewDecorationForNewVariable(
    Instruction* old_decoration, uint32_t new_var_id, uint32_t new_binding) {
  assert(old_decoration->opcode() == spv::Op::OpDecorate ||
         old_decoration->opcode() == spv::Op::OpDecorateString);
  std::unique_ptr<Instruction> new_decoration(old_decoration->Clone(context()));
  new_decoration->SetInOperand(0, {new_var_id});

  if (IsDecorationBinding(new_decoration.get())) {
    new_decoration->SetInOperand(2, {new_binding});
  }
  context()->AddAnnotationInst(std::move(new_decoration));
}